

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost.c
# Opt level: O2

void SetResidualCoeffs_C(int16_t *coeffs,VP8Residual *res)

{
  uint uVar1;
  
  res->last = -1;
  uVar1 = 0xf;
  do {
    if ((int)uVar1 < 0) {
LAB_001253d9:
      res->coeffs = coeffs;
      return;
    }
    if (coeffs[uVar1] != 0) {
      res->last = uVar1;
      goto LAB_001253d9;
    }
    uVar1 = uVar1 - 1;
  } while( true );
}

Assistant:

static void SetResidualCoeffs_C(const int16_t* WEBP_RESTRICT const coeffs,
                                VP8Residual* WEBP_RESTRICT const res) {
  int n;
  res->last = -1;
  assert(res->first == 0 || coeffs[0] == 0);
  for (n = 15; n >= 0; --n) {
    if (coeffs[n]) {
      res->last = n;
      break;
    }
  }
  res->coeffs = coeffs;
}